

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O1

void lws_set_timeout(lws *wsi,pending_timeout reason,int secs)

{
  int secs_00;
  
  lws_dll2_remove(&(wsi->sul_timeout).list);
  if (secs == 0) {
    return;
  }
  if (secs != -2) {
    secs_00 = 0;
    if ((secs != -1) && (secs_00 = secs, (wsi->field_0x2dc & 8) != 0)) {
      _lws_log(1,"%s: on immortal stream %d %d\n","lws_set_timeout",reason,(ulong)(uint)secs);
    }
    __lws_set_timeout(wsi,reason,secs_00);
    return;
  }
  _lws_log(0x10,"synchronously killing %p\n",wsi);
  lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"to sync kill");
  return;
}

Assistant:

void
lws_set_timeout(struct lws *wsi, enum pending_timeout reason, int secs)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];

	lws_pt_lock(pt, __func__);
	lws_dll2_remove(&wsi->sul_timeout.list);
	lws_pt_unlock(pt);

	if (!secs)
		return;

	if (secs == LWS_TO_KILL_SYNC) {
		lwsl_debug("synchronously killing %p\n", wsi);
		lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
				   "to sync kill");
		return;
	}

	if (secs == LWS_TO_KILL_ASYNC)
		secs = 0;

	// assert(!secs || !wsi->mux_stream_immortal);
	if (secs && wsi->mux_stream_immortal)
		lwsl_err("%s: on immortal stream %d %d\n", __func__, reason, secs);

	lws_pt_lock(pt, __func__);
	__lws_set_timeout(wsi, reason, secs);
	lws_pt_unlock(pt);
}